

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

size_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
::encode_scan(jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
              *this,unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_>
                    *process_line,byte_span destination)

{
  process_line *ppVar1;
  process_line *ppVar2;
  
  ppVar1 = (process_line->_M_t).
           super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>.
           _M_t.
           super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
           .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
  (process_line->_M_t).
  super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>._M_t.
  super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>.
  super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl = (process_line *)0x0;
  ppVar2 = (this->super_encoder_strategy).process_line_._M_t.
           super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>.
           _M_t.
           super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
           .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
  (this->super_encoder_strategy).process_line_._M_t.
  super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>._M_t.
  super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>.
  super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl = ppVar1;
  if (ppVar2 != (process_line *)0x0) {
    (*ppVar2->_vptr_process_line[1])();
  }
  (this->super_encoder_strategy).bit_buffer_ = 0;
  (this->super_encoder_strategy).free_bit_count_ = 0x20;
  (this->super_encoder_strategy).position_ = destination.data;
  (this->super_encoder_strategy).compressed_length_ = destination.size;
  encode_lines(this);
  return (this->super_encoder_strategy).bytes_written_ -
         ((long)(this->super_encoder_strategy).free_bit_count_ - 0x20U >> 3);
}

Assistant:

size_t encode_scan(std::unique_ptr<process_line> process_line, byte_span destination)
    {
        Strategy::process_line_ = std::move(process_line);

        Strategy::initialize(destination);
        encode_lines();

        return Strategy::get_length();
    }